

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O3

void ncnn::im2col_sgemm_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  void *pvVar7;
  size_t sVar8;
  void *pvVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  byte bVar16;
  byte bVar17;
  int *piVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  undefined1 *puVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  undefined1 (*pauVar29) [16];
  long lVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  undefined1 (*pauVar34) [16];
  ulong *puVar35;
  long lVar36;
  undefined1 (*pauVar37) [16];
  ulong *puVar38;
  size_t sVar39;
  undefined1 (*pauVar40) [16];
  long lVar41;
  long lVar42;
  undefined1 (*pauVar43) [16];
  void *pvVar44;
  undefined1 *puVar45;
  undefined1 (*pauVar46) [16];
  long lVar47;
  undefined1 (*pauVar48) [16];
  int iVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  uint uVar53;
  void *pvVar54;
  ushort uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar64 [16];
  undefined1 auVar63 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  uint uVar67;
  undefined8 uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  long local_d0;
  undefined1 local_88 [64];
  size_t local_48;
  ulong local_40;
  ulong local_38;
  undefined1 auVar59 [16];
  
  uVar5 = bottom_im2col->w;
  iVar49 = bottom_im2col->h;
  uVar67 = bottom_im2col->c;
  lVar50 = (long)(int)uVar67;
  iVar6 = top_blob->c;
  local_48 = 0;
  local_88._0_8_ = (void *)0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_8_ = 0;
  local_88._24_4_ = 0;
  local_88._32_8_ = (Allocator *)0x0;
  local_88._40_4_ = 0;
  local_88._44_4_ = 0;
  local_88._48_12_ = SUB1612((undefined1  [16])0x0,4);
  iVar32 = iVar49;
  uVar19 = uVar5;
  if (lVar50 < 4) {
    uVar24 = uVar67;
    if ((int)uVar5 < 4) {
      iVar51 = 1;
      sVar39 = 1;
      if ((int)uVar5 < 2) goto LAB_001fab9d;
      iVar32 = iVar49 * 2;
      uVar19 = (uVar5 & 1) + 1;
    }
    else {
      uVar19 = (uVar5 & 1) + (uVar5 >> 2) + (uint)((uVar5 >> 1 & 1) != 0);
      iVar32 = iVar49 * 4;
    }
    iVar51 = 1;
    sVar39 = 1;
  }
  else {
    if ((int)uVar5 < 4) {
      if ((int)uVar5 < 2) {
        iVar51 = 4;
        sVar39 = 4;
        uVar24 = (uVar67 & 3) + (uVar67 >> 2);
        goto LAB_001fab9d;
      }
      iVar32 = iVar49 * 2;
      uVar24 = (uVar67 & 3) + (uVar67 >> 2);
      uVar19 = (uVar5 & 1) + 1;
    }
    else {
      iVar32 = iVar49 * 4;
      uVar24 = (uVar67 & 3) + (uVar67 >> 2);
      uVar19 = (uVar5 & 1) + (uVar5 >> 2) + (uint)((uVar5 >> 1 & 1) != 0);
    }
    iVar51 = 4;
    sVar39 = 4;
  }
LAB_001fab9d:
  Mat::create((Mat *)local_88,iVar32,uVar24,uVar19,sVar39,iVar51,(Allocator *)opt);
  uVar31 = (ulong)uVar67;
  uVar20 = (ulong)(int)uVar5;
  uVar19 = (int)uVar5 >> 2;
  if (0 < (int)uVar19) {
    local_40 = (ulong)uVar19;
    local_d0 = 1;
    lVar41 = 3;
    uVar28 = 0;
    do {
      puVar45 = (undefined1 *)(local_48 * uVar28 * local_88._16_8_ + local_88._0_8_);
      if ((int)uVar67 < 4) {
        uVar26 = 0;
      }
      else {
        lVar47 = 3;
        lVar27 = 2;
        lVar52 = 1;
        uVar25 = 0;
        do {
          if (0 < iVar49) {
            lVar22 = bottom_im2col->cstep * bottom_im2col->elemsize;
            lVar36 = lVar22 * lVar47;
            lVar42 = (long)bottom_im2col->data + local_d0;
            lVar30 = lVar22 * lVar27;
            lVar33 = lVar22 * uVar25;
            lVar22 = lVar22 * lVar52;
            iVar32 = iVar49;
            do {
              *puVar45 = *(undefined1 *)(lVar42 + -1 + lVar33);
              puVar45[1] = *(undefined1 *)(lVar42 + -1 + lVar22);
              puVar45[2] = *(undefined1 *)(lVar42 + -1 + lVar30);
              puVar45[3] = *(undefined1 *)(lVar42 + -1 + lVar36);
              puVar45[4] = *(undefined1 *)(lVar42 + lVar33);
              puVar45[5] = *(undefined1 *)(lVar42 + lVar22);
              puVar45[6] = *(undefined1 *)(lVar42 + lVar30);
              puVar45[7] = *(undefined1 *)(lVar42 + lVar36);
              puVar45[8] = *(undefined1 *)(lVar42 + 1 + lVar33);
              puVar45[9] = *(undefined1 *)(lVar42 + 1 + lVar22);
              puVar45[10] = *(undefined1 *)(lVar42 + 1 + lVar30);
              puVar45[0xb] = *(undefined1 *)(lVar42 + 1 + lVar36);
              puVar45[0xc] = *(undefined1 *)(lVar42 + 2 + lVar33);
              puVar45[0xd] = *(undefined1 *)(lVar42 + 2 + lVar22);
              puVar45[0xe] = *(undefined1 *)(lVar42 + 2 + lVar30);
              puVar45[0xf] = *(undefined1 *)(lVar42 + 2 + lVar36);
              puVar45 = puVar45 + 0x10;
              lVar42 = lVar42 + (ulong)uVar5;
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
          }
          uVar26 = uVar25 + 4;
          lVar22 = uVar25 + 7;
          lVar47 = lVar47 + 4;
          lVar27 = lVar27 + 4;
          lVar52 = lVar52 + 4;
          uVar25 = uVar26;
          local_38 = uVar28;
        } while (lVar22 < lVar50);
      }
      if ((int)uVar26 < (int)uVar67) {
        uVar26 = uVar26 & 0xffffffff;
        do {
          if (0 < iVar49) {
            puVar23 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 + lVar41);
            iVar32 = iVar49;
            do {
              *puVar45 = puVar23[-3];
              puVar45[1] = puVar23[-2];
              puVar45[2] = puVar23[-1];
              puVar45[3] = *puVar23;
              puVar45 = puVar45 + 4;
              puVar23 = puVar23 + uVar5;
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar31);
      }
      uVar28 = uVar28 + 1;
      local_d0 = local_d0 + 4;
      lVar41 = lVar41 + 4;
    } while (uVar28 != local_40);
  }
  uVar28 = uVar20 & 0xfffffffffffffffc;
  uVar24 = uVar5 >> 1 & 1;
  if (uVar24 != 0) {
    puVar45 = (undefined1 *)((long)(int)uVar19 * local_48 * local_88._16_8_ + local_88._0_8_);
    uVar26 = 0;
    if (3 < (int)uVar67) {
      lVar41 = 1;
      lVar27 = 2;
      lVar47 = 3;
      uVar25 = 0;
      do {
        if (0 < iVar49) {
          pvVar7 = bottom_im2col->data;
          lVar30 = bottom_im2col->cstep * bottom_im2col->elemsize;
          lVar22 = (long)pvVar7 + lVar30 * uVar25 + 1;
          lVar52 = (long)pvVar7 + lVar30 * lVar41 + 1;
          lVar33 = (long)pvVar7 + lVar30 * lVar27 + 1;
          lVar30 = (long)pvVar7 + lVar30 * lVar47 + 1;
          iVar32 = iVar49;
          do {
            *puVar45 = *(undefined1 *)(lVar22 + -1 + uVar28);
            puVar45[1] = *(undefined1 *)(lVar52 + -1 + uVar28);
            puVar45[2] = *(undefined1 *)(lVar33 + -1 + uVar28);
            puVar45[3] = *(undefined1 *)(lVar30 + -1 + uVar28);
            puVar45[4] = *(undefined1 *)(lVar22 + uVar28);
            puVar45[5] = *(undefined1 *)(lVar52 + uVar28);
            puVar45[6] = *(undefined1 *)(lVar33 + uVar28);
            puVar45[7] = *(undefined1 *)(lVar30 + uVar28);
            puVar45 = puVar45 + 8;
            lVar22 = lVar22 + uVar20;
            lVar52 = lVar52 + uVar20;
            lVar33 = lVar33 + uVar20;
            lVar30 = lVar30 + uVar20;
            iVar32 = iVar32 + -1;
          } while (iVar32 != 0);
        }
        uVar26 = uVar25 + 4;
        lVar52 = uVar25 + 7;
        lVar41 = lVar41 + 4;
        lVar27 = lVar27 + 4;
        lVar47 = lVar47 + 4;
        uVar25 = uVar26;
      } while (lVar52 < lVar50);
    }
    if ((int)uVar26 < (int)uVar67) {
      uVar26 = uVar26 & 0xffffffff;
      do {
        if (0 < iVar49) {
          puVar23 = (undefined1 *)
                    ((long)bottom_im2col->data +
                    bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 + uVar28 + 1);
          iVar32 = iVar49;
          do {
            *puVar45 = puVar23[-1];
            puVar45[1] = *puVar23;
            puVar45 = puVar45 + 2;
            puVar23 = puVar23 + uVar20;
            iVar32 = iVar32 + -1;
          } while (iVar32 != 0);
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar31);
    }
  }
  iVar32 = (int)uVar28 + uVar24 * 2;
  if (iVar32 < (int)uVar5) {
    uVar28 = (ulong)iVar32;
    do {
      iVar32 = (int)uVar28;
      iVar51 = iVar32 + 3;
      if (-1 < iVar32) {
        iVar51 = iVar32;
      }
      puVar45 = (undefined1 *)
                ((long)(int)((iVar32 - (((uint)(uVar28 >> 0x1f) & 1) + iVar32 & 0xfffffffe)) +
                             (iVar51 >> 2) +
                            (int)((char)((char)uVar28 - ((byte)iVar51 & 0xfc)) / '\x02')) * local_48
                 * local_88._16_8_ + local_88._0_8_);
      if ((int)uVar67 < 4) {
        uVar26 = 0;
      }
      else {
        lVar41 = 1;
        lVar27 = 2;
        lVar47 = 3;
        uVar25 = 0;
        do {
          if (0 < iVar49) {
            lVar52 = bottom_im2col->cstep * bottom_im2col->elemsize;
            lVar22 = (long)bottom_im2col->data + uVar28;
            iVar32 = iVar49;
            do {
              *puVar45 = *(undefined1 *)(lVar22 + lVar52 * uVar25);
              puVar45[1] = *(undefined1 *)(lVar22 + lVar52 * lVar41);
              puVar45[2] = *(undefined1 *)(lVar22 + lVar52 * lVar27);
              puVar45[3] = *(undefined1 *)(lVar22 + lVar52 * lVar47);
              puVar45 = puVar45 + 4;
              lVar22 = lVar22 + uVar20;
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
          }
          uVar26 = uVar25 + 4;
          lVar52 = uVar25 + 7;
          lVar41 = lVar41 + 4;
          lVar27 = lVar27 + 4;
          lVar47 = lVar47 + 4;
          uVar25 = uVar26;
        } while (lVar52 < lVar50);
      }
      if ((int)uVar26 < (int)uVar67) {
        uVar26 = uVar26 & 0xffffffff;
        do {
          if (0 < iVar49) {
            puVar23 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      uVar28 + bottom_im2col->cstep * uVar26 * bottom_im2col->elemsize);
            iVar32 = iVar49;
            do {
              *puVar45 = *puVar23;
              puVar45 = puVar45 + 1;
              puVar23 = puVar23 + uVar20;
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar31);
      }
      uVar28 = uVar28 + 1;
    } while ((long)uVar28 < (long)uVar20);
  }
  if (0 < iVar6 >> 2) {
    uVar19 = uVar67 + 3;
    if (-1 < (int)uVar67) {
      uVar19 = uVar67;
    }
    iVar51 = ((int)uVar19 >> 2) * iVar49;
    iVar32 = ((int)uVar67 % 4) * iVar49;
    uVar31 = 0;
    do {
      sVar39 = top_blob->cstep;
      pvVar7 = top_blob->data;
      sVar8 = top_blob->elemsize;
      pauVar40 = (undefined1 (*) [16])(uVar31 * 4 * sVar39 * sVar8 + (long)pvVar7);
      pauVar43 = (undefined1 (*) [16])((uVar31 * 4 + 1) * sVar39 * sVar8 + (long)pvVar7);
      pauVar46 = (undefined1 (*) [16])((uVar31 * 4 + 2) * sVar39 * sVar8 + (long)pvVar7);
      pauVar48 = (undefined1 (*) [16])((uVar31 * 4 + 3) * sVar39 * sVar8 + (long)pvVar7);
      if ((int)uVar5 < 4) {
        uVar28 = 0;
      }
      else {
        uVar26 = 0;
        do {
          pauVar37 = (undefined1 (*) [16])
                     ((uVar26 >> 2) * local_48 * local_88._16_8_ + local_88._0_8_);
          pauVar29 = (undefined1 (*) [16])
                     (kernel->cstep * uVar31 * kernel->elemsize + (long)kernel->data);
          auVar63 = ZEXT1664((undefined1  [16])0x0);
          if (iVar51 < 1) {
            auVar65 = ZEXT1664((undefined1  [16])0x0);
          }
          else {
            auVar65 = ZEXT1664((undefined1  [16])0x0);
            auVar66 = ZEXT1664((undefined1  [16])0x0);
            auVar71 = ZEXT1664((undefined1  [16])0x0);
            iVar21 = iVar51;
            do {
              auVar61 = vpmovsxbw_avx2(*pauVar37);
              auVar77 = vpermq_avx2(auVar61,0x50);
              auVar13 = vpermq_avx2(auVar61,0xfa);
              auVar12 = vpmovsxbw_avx2(*pauVar29);
              auVar14 = vpermq_avx2(auVar61,5);
              auVar15 = vpermq_avx2(auVar61,0xaf);
              auVar61 = vpmaddwd_avx2(auVar12,auVar77);
              auVar61 = vpaddd_avx2(auVar61,auVar63._0_32_);
              auVar63 = ZEXT3264(auVar61);
              auVar77 = vpmaddwd_avx2(auVar14,auVar12);
              auVar77 = vpaddd_avx2(auVar77,auVar66._0_32_);
              auVar66 = ZEXT3264(auVar77);
              auVar13 = vpmaddwd_avx2(auVar12,auVar13);
              auVar13 = vpaddd_avx2(auVar13,auVar65._0_32_);
              auVar65 = ZEXT3264(auVar13);
              auVar12 = vpmaddwd_avx2(auVar12,auVar15);
              auVar12 = vpaddd_avx2(auVar12,auVar71._0_32_);
              auVar71 = ZEXT3264(auVar12);
              pauVar37 = pauVar37 + 1;
              pauVar29 = pauVar29 + 1;
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
            auVar61 = vphaddd_avx2(auVar61,auVar77);
            auVar77 = vphaddd_avx2(auVar13,auVar12);
            auVar61 = vpermq_avx2(auVar61,0x9c);
            auVar65 = ZEXT3264(auVar61);
            auVar61 = vpermq_avx2(auVar77,0x9c);
            auVar63 = ZEXT3264(auVar61);
          }
          auVar56 = auVar63._0_16_;
          auVar58 = auVar65._0_16_;
          auVar57 = auVar65._16_16_;
          auVar64 = auVar63._16_16_;
          if (0 < iVar32) {
            lVar50 = 0;
            do {
              auVar58._8_8_ = 0;
              auVar58._0_8_ = *(ulong *)(*pauVar37 + lVar50 * 4);
              auVar58 = vpmovsxbw_avx(auVar58);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = *(ulong *)(*pauVar29 + lVar50 * 4);
              auVar56 = vpmovsxbw_avx(auVar56);
              auVar69 = vpshuflw_avx(auVar58,0x50);
              auVar69 = vpshufd_avx(auVar69,0x50);
              auVar74._0_8_ = auVar56._0_8_;
              auVar74._8_8_ = auVar74._0_8_;
              auVar72 = vpmullw_avx(auVar69,auVar74);
              auVar56 = vpmulhw_avx(auVar69,auVar74);
              auVar58 = vpshuflw_avx(auVar58,0xfa);
              auVar58 = vpshufd_avx(auVar58,0x50);
              auVar11 = vpmullw_avx(auVar58,auVar74);
              auVar69 = vpmulhw_avx(auVar58,auVar74);
              auVar58 = vpunpcklwd_avx(auVar72,auVar56);
              auVar58 = vpaddd_avx(auVar65._0_16_,auVar58);
              auVar65 = ZEXT1664(auVar58);
              auVar56 = vpunpckhwd_avx(auVar72,auVar56);
              auVar57 = vpaddd_avx(auVar57,auVar56);
              auVar56 = vpunpcklwd_avx(auVar11,auVar69);
              auVar56 = vpaddd_avx(auVar63._0_16_,auVar56);
              auVar63 = ZEXT1664(auVar56);
              auVar69 = vpunpckhwd_avx(auVar11,auVar69);
              auVar64 = vpaddd_avx(auVar64,auVar69);
              lVar50 = lVar50 + 1;
            } while (iVar32 != (int)lVar50);
          }
          auVar69 = vpunpckldq_avx(auVar58,auVar57);
          auVar72 = vpunpckldq_avx(auVar56,auVar64);
          auVar58 = vpunpckhdq_avx(auVar58,auVar57);
          auVar57 = vpunpckhdq_avx(auVar56,auVar64);
          auVar64 = vpunpcklqdq_avx(auVar69,auVar72);
          auVar56 = vpunpckhqdq_avx(auVar69,auVar72);
          auVar69 = vpunpcklqdq_avx(auVar58,auVar57);
          auVar58 = vpunpckhqdq_avx(auVar58,auVar57);
          *pauVar40 = auVar64;
          *pauVar43 = auVar56;
          *pauVar46 = auVar69;
          *pauVar48 = auVar58;
          pauVar40 = pauVar40 + 1;
          pauVar43 = pauVar43 + 1;
          pauVar46 = pauVar46 + 1;
          pauVar48 = pauVar48 + 1;
          uVar28 = uVar26 + 4;
          lVar50 = uVar26 + 7;
          uVar26 = uVar28;
        } while (lVar50 < (long)uVar20);
      }
      uVar19 = (uint)uVar28;
      if ((int)(uVar19 | 1) < (int)uVar5) {
        pauVar29 = (undefined1 (*) [16])
                   (kernel->cstep * uVar31 * kernel->elemsize + (long)kernel->data);
        do {
          uVar24 = (uint)uVar28;
          pauVar34 = (undefined1 (*) [16])
                     ((ulong)(((uint)(uVar28 >> 2) & 0x3fffffff) + (uint)((uVar24 >> 1 & 1) != 0)) *
                      local_48 * local_88._16_8_ + local_88._0_8_);
          auVar63 = ZEXT1664((undefined1  [16])0x0);
          pauVar37 = pauVar29;
          if (0 < iVar51) {
            auVar65 = ZEXT1664((undefined1  [16])0x0);
            iVar21 = iVar51;
            do {
              auVar61 = vpmovsxbw_avx2(*pauVar34);
              auVar13 = vpermq_avx2(auVar61,0x50);
              auVar77 = vpmovsxbw_avx2(*pauVar37);
              auVar12 = vpermq_avx2(auVar61,5);
              auVar61 = vpmaddwd_avx2(auVar13,auVar77);
              auVar61 = vpaddd_avx2(auVar61,auVar63._0_32_);
              auVar63 = ZEXT3264(auVar61);
              auVar77 = vpmaddwd_avx2(auVar12,auVar77);
              auVar77 = vpaddd_avx2(auVar77,auVar65._0_32_);
              auVar65 = ZEXT3264(auVar77);
              pauVar34 = (undefined1 (*) [16])(*pauVar34 + 8);
              pauVar37 = pauVar37 + 1;
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
            auVar61 = vphaddd_avx2(auVar61,auVar77);
            auVar61 = vpermq_avx2(auVar61,0x9c);
            auVar63 = ZEXT3264(auVar61);
          }
          auVar58 = auVar63._0_16_;
          auVar57 = auVar63._16_16_;
          if (0 < iVar32) {
            lVar50 = 0;
            do {
              auVar58 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar34 + lVar50 * 2)));
              auVar58 = vpshuflw_avx(auVar58,0x50);
              auVar56 = vpshufd_avx(auVar58,0x50);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = *(ulong *)(*pauVar37 + lVar50 * 4);
              auVar58 = vpmovsxbw_avx(auVar64);
              auVar69._0_8_ = auVar58._0_8_;
              auVar69._8_8_ = auVar69._0_8_;
              auVar64 = vpmullw_avx(auVar56,auVar69);
              auVar56 = vpmulhw_avx(auVar56,auVar69);
              auVar58 = vpunpcklwd_avx(auVar64,auVar56);
              auVar58 = vpaddd_avx(auVar63._0_16_,auVar58);
              auVar63 = ZEXT1664(auVar58);
              auVar56 = vpunpckhwd_avx(auVar64,auVar56);
              auVar57 = vpaddd_avx(auVar57,auVar56);
              lVar50 = lVar50 + 1;
            } while (iVar32 != (int)lVar50);
          }
          *(int *)*pauVar40 = auVar58._0_4_;
          *(int *)*pauVar43 = auVar58._4_4_;
          *(int *)*pauVar46 = auVar58._8_4_;
          *(int *)*pauVar48 = auVar58._12_4_;
          *(int *)(*pauVar40 + 4) = auVar57._0_4_;
          *(int *)(*pauVar43 + 4) = auVar57._4_4_;
          *(int *)(*pauVar46 + 4) = auVar57._8_4_;
          *(int *)(*pauVar48 + 4) = auVar57._12_4_;
          pauVar40 = (undefined1 (*) [16])(*pauVar40 + 8);
          pauVar43 = (undefined1 (*) [16])(*pauVar43 + 8);
          pauVar46 = (undefined1 (*) [16])(*pauVar46 + 8);
          pauVar48 = (undefined1 (*) [16])(*pauVar48 + 8);
          uVar19 = uVar24 + 2;
          uVar28 = (ulong)uVar19;
        } while ((int)(uVar24 + 3) < (int)uVar5);
      }
      if ((int)uVar19 < (int)uVar5) {
        pauVar29 = (undefined1 (*) [16])
                   (kernel->cstep * uVar31 * kernel->elemsize + (long)kernel->data);
        do {
          puVar38 = (ulong *)((ulong)((uVar19 & 1) + (uVar19 >> 2) + (uint)((uVar19 >> 1 & 1) != 0))
                              * local_48 * local_88._16_8_ + local_88._0_8_);
          auVar63 = ZEXT1664((undefined1  [16])0x0);
          pauVar37 = pauVar29;
          if (0 < iVar51) {
            auVar65 = ZEXT1664((undefined1  [16])0x0);
            auVar66 = ZEXT1664((undefined1  [16])0x0);
            auVar71 = ZEXT1664((undefined1  [16])0x0);
            iVar21 = iVar51;
            do {
              auVar57._8_8_ = 0;
              auVar57._0_8_ = *puVar38;
              auVar56 = vpmovsxbw_avx(auVar57);
              auVar58 = *pauVar37;
              auVar57 = vpcmpgtb_avx((undefined1  [16])0x0,auVar58);
              auVar64 = vpunpcklbw_avx(auVar58,auVar57);
              auVar58 = vpunpckhbw_avx(auVar58,auVar57);
              auVar72._0_8_ = auVar56._0_8_;
              auVar72._8_8_ = auVar72._0_8_;
              auVar56 = vpmullw_avx(auVar64,auVar72);
              auVar57 = vpmulhw_avx(auVar64,auVar72);
              auVar69 = vpmullw_avx(auVar72,auVar58);
              auVar64 = vpmulhw_avx(auVar72,auVar58);
              auVar58 = vpunpcklwd_avx(auVar56,auVar57);
              auVar58 = vpaddd_avx(auVar71._0_16_,auVar58);
              auVar71 = ZEXT1664(auVar58);
              auVar57 = vpunpckhwd_avx(auVar56,auVar57);
              auVar57 = vpaddd_avx(auVar66._0_16_,auVar57);
              auVar66 = ZEXT1664(auVar57);
              auVar56 = vpunpcklwd_avx(auVar69,auVar64);
              auVar56 = vpaddd_avx(auVar65._0_16_,auVar56);
              auVar65 = ZEXT1664(auVar56);
              auVar64 = vpunpckhwd_avx(auVar69,auVar64);
              auVar64 = vpaddd_avx(auVar63._0_16_,auVar64);
              auVar63 = ZEXT1664(auVar64);
              puVar38 = (ulong *)((long)puVar38 + 4);
              pauVar37 = pauVar37 + 1;
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
            auVar69 = vpunpckldq_avx(auVar58,auVar57);
            auVar72 = vpunpckldq_avx(auVar56,auVar64);
            auVar57 = vpunpckhdq_avx(auVar58,auVar57);
            auVar56 = vpunpckhdq_avx(auVar56,auVar64);
            auVar64 = vpunpcklqdq_avx(auVar69,auVar72);
            auVar58 = vpunpckhqdq_avx(auVar69,auVar72);
            auVar58 = vpaddd_avx(auVar64,auVar58);
            auVar64 = vpunpcklqdq_avx(auVar57,auVar56);
            auVar57 = vpunpckhqdq_avx(auVar57,auVar56);
            auVar57 = vpaddd_avx(auVar57,auVar64);
            auVar58 = vpaddd_avx(auVar58,auVar57);
            auVar63 = ZEXT1664(auVar58);
          }
          auVar58 = auVar63._0_16_;
          if (0 < iVar32) {
            lVar50 = 0;
            do {
              auVar56 = vpbroadcastw_avx512vl();
              auVar11._8_8_ = 0;
              auVar11._0_8_ = *(ulong *)(*pauVar37 + lVar50 * 4);
              auVar58 = vpmovsxbw_avx(auVar11);
              auVar57 = vpmullw_avx(auVar56,auVar58);
              auVar58 = vpmulhw_avx(auVar56,auVar58);
              auVar58 = vpunpcklwd_avx(auVar57,auVar58);
              auVar58 = vpaddd_avx(auVar63._0_16_,auVar58);
              auVar63 = ZEXT1664(auVar58);
              lVar50 = lVar50 + 1;
            } while (iVar32 != (int)lVar50);
          }
          *(int *)*pauVar40 = auVar58._0_4_;
          *(int *)*pauVar43 = auVar58._4_4_;
          *(int *)*pauVar46 = auVar58._8_4_;
          *(int *)*pauVar48 = auVar58._12_4_;
          pauVar40 = (undefined1 (*) [16])(*pauVar40 + 4);
          pauVar43 = (undefined1 (*) [16])(*pauVar43 + 4);
          pauVar46 = (undefined1 (*) [16])(*pauVar46 + 4);
          pauVar48 = (undefined1 (*) [16])(*pauVar48 + 4);
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar5);
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 != (uint)(iVar6 >> 2));
  }
  uVar31 = (long)iVar6 & 0xfffffffffffffffc;
  if ((int)uVar31 != iVar6) {
    pvVar7 = top_blob->data;
    sVar39 = top_blob->cstep;
    sVar8 = top_blob->elemsize;
    lVar41 = local_48 * local_88._16_8_;
    pvVar9 = kernel->data;
    lVar50 = kernel->cstep * kernel->elemsize;
    uVar19 = uVar67 + 3;
    if (-1 < (int)uVar67) {
      uVar19 = uVar67;
    }
    iVar32 = ((int)uVar19 >> 2) * iVar49;
    iVar49 = ((int)uVar67 % 4) * iVar49;
    auVar63 = vpbroadcastq_avx512f();
    auVar65 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar66 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      pauVar40 = (undefined1 (*) [16])(sVar39 * sVar8 * uVar31 + (long)pvVar7);
      uVar67 = (uint)uVar31;
      if ((int)uVar5 < 4) {
        uVar28 = 0;
      }
      else {
        uVar19 = uVar67 + 3;
        if (-1 < (int)uVar67) {
          uVar19 = uVar67;
        }
        uVar26 = 0;
        do {
          pauVar43 = (undefined1 (*) [16])((uVar26 >> 2) * lVar41 + local_88._0_8_);
          if (iVar32 < 1) {
            auVar71 = ZEXT1664((undefined1  [16])0x0);
          }
          else {
            auVar71 = ZEXT1664((undefined1  [16])0x0);
            auVar73 = ZEXT1664((undefined1  [16])0x0);
            puVar38 = (ulong *)((int)(((int)uVar19 >> 2) + (uVar67 - (uVar19 & 0xfffffffc))) *
                                lVar50 + (long)pvVar9);
            iVar51 = iVar32;
            do {
              auVar61 = vpmovsxbw_avx2(*pauVar43);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *puVar38;
              auVar58 = vpmovsxbw_avx(auVar1);
              auVar77._0_8_ = auVar58._0_8_;
              auVar77._8_8_ = auVar77._0_8_;
              auVar77._16_8_ = auVar77._0_8_;
              auVar77._24_8_ = auVar77._0_8_;
              auVar13 = vpmullw_avx2(auVar77,auVar61);
              auVar77 = vpmulhw_avx2(auVar61,auVar77);
              auVar61 = vpunpcklwd_avx2(auVar13,auVar77);
              auVar61 = vpaddd_avx2(auVar73._0_32_,auVar61);
              auVar73 = ZEXT3264(auVar61);
              auVar77 = vpunpckhwd_avx2(auVar13,auVar77);
              auVar77 = vpaddd_avx2(auVar71._0_32_,auVar77);
              auVar71 = ZEXT3264(auVar77);
              pauVar43 = pauVar43 + 1;
              puVar38 = (ulong *)((long)puVar38 + 4);
              iVar51 = iVar51 + -1;
            } while (iVar51 != 0);
            auVar58 = vpshufd_avx(auVar61._0_16_,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar61._0_16_);
            auVar57 = vpshufd_avx(auVar77._0_16_,0xee);
            auVar57 = vpaddd_avx(auVar57,auVar77._0_16_);
            auVar57 = vphaddd_avx(auVar58,auVar57);
            auVar58 = vpshufd_avx(auVar61._16_16_,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar61._16_16_);
            auVar56 = vphaddd_avx(auVar58,auVar58);
            auVar58 = vpshufd_avx(auVar77._16_16_,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar77._16_16_);
            auVar58 = vphaddd_avx(auVar58,auVar58);
            auVar57 = vpshufd_avx(auVar57,0xe8);
            auVar57 = vpunpcklqdq_avx(auVar57,auVar56);
            auVar70._0_4_ = auVar58._0_4_;
            auVar70._4_4_ = auVar70._0_4_;
            auVar70._8_4_ = auVar70._0_4_;
            auVar70._12_4_ = auVar70._0_4_;
            auVar58 = vpblendd_avx2(auVar57,auVar70,8);
            auVar71 = ZEXT1664(auVar58);
          }
          auVar58 = auVar71._0_16_;
          if (0 < iVar49) {
            lVar27 = 0;
            do {
              auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(*pauVar43 + lVar27 * 4)));
              auVar57 = vpbroadcastd_avx512vl();
              auVar58 = vpmulld_avx(auVar57,auVar58);
              auVar58 = vpaddd_avx(auVar58,auVar71._0_16_);
              auVar71 = ZEXT1664(auVar58);
              lVar27 = lVar27 + 1;
            } while (iVar49 != (int)lVar27);
          }
          *pauVar40 = auVar58;
          pauVar40 = pauVar40 + 1;
          uVar28 = uVar26 + 4;
          lVar27 = uVar26 + 7;
          uVar26 = uVar28;
        } while (lVar27 < (long)uVar20);
      }
      uVar19 = (uint)uVar28;
      if ((int)(uVar19 | 1) < (int)uVar5) {
        uVar24 = uVar67 + 3;
        if (-1 < (int)uVar67) {
          uVar24 = uVar67;
        }
        do {
          uVar53 = (uint)uVar28;
          puVar38 = (ulong *)((ulong)(((uint)(uVar28 >> 2) & 0x3fffffff) +
                                     (uint)((uVar53 >> 1 & 1) != 0)) * lVar41 + local_88._0_8_);
          auVar71 = ZEXT1664((undefined1  [16])0x0);
          if (0 < iVar32) {
            auVar73 = ZEXT1664((undefined1  [16])0x0);
            puVar35 = (ulong *)((int)(((int)uVar24 >> 2) + (uVar67 - (uVar24 & 0xfffffffc))) *
                                lVar50 + (long)pvVar9);
            iVar51 = iVar32;
            do {
              auVar75._8_8_ = 0;
              auVar75._0_8_ = *puVar38;
              auVar58 = vpcmpgtb_avx((undefined1  [16])0x0,auVar75);
              auVar57 = vpunpcklbw_avx(auVar75,auVar58);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *puVar35;
              auVar58 = vpmovsxbw_avx(auVar2);
              auVar76._0_8_ = auVar58._0_8_;
              auVar76._8_8_ = auVar76._0_8_;
              auVar56 = vpmullw_avx(auVar76,auVar57);
              auVar57 = vpmulhw_avx(auVar57,auVar76);
              auVar58 = vpunpcklwd_avx(auVar56,auVar57);
              auVar58 = vpaddd_avx(auVar73._0_16_,auVar58);
              auVar73 = ZEXT1664(auVar58);
              auVar57 = vpunpckhwd_avx(auVar56,auVar57);
              auVar57 = vpaddd_avx(auVar71._0_16_,auVar57);
              auVar71 = ZEXT1664(auVar57);
              puVar38 = puVar38 + 1;
              puVar35 = (ulong *)((long)puVar35 + 4);
              iVar51 = iVar51 + -1;
            } while (iVar51 != 0);
            auVar56 = vpshufd_avx(auVar58,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar56);
            auVar56 = vpshufd_avx(auVar57,0xee);
            auVar57 = vpaddd_avx(auVar57,auVar56);
            auVar58 = vphaddd_avx(auVar58,auVar57);
            auVar58 = vpshufd_avx(auVar58,0xe8);
            auVar71 = ZEXT1664(auVar58);
          }
          uVar68 = auVar71._0_8_;
          if (0 < iVar49) {
            lVar27 = 0;
            do {
              auVar58 = vpmovsxbd_avx(ZEXT216(*(ushort *)((long)puVar38 + lVar27 * 2)));
              auVar57 = vpbroadcastd_avx512vl();
              auVar58 = vpmulld_avx(auVar57,auVar58);
              auVar58 = vpaddd_avx(auVar58,auVar71._0_16_);
              auVar71 = ZEXT1664(auVar58);
              uVar68 = auVar58._0_8_;
              lVar27 = lVar27 + 1;
            } while (iVar49 != (int)lVar27);
          }
          *(undefined8 *)*pauVar40 = uVar68;
          pauVar40 = (undefined1 (*) [16])((long)*pauVar40 + 8);
          uVar19 = uVar53 + 2;
          uVar28 = (ulong)uVar19;
        } while ((int)(uVar53 + 3) < (int)uVar5);
      }
      if ((int)uVar19 < (int)uVar5) {
        uVar24 = uVar67 + 3;
        if (-1 < (int)uVar67) {
          uVar24 = uVar67;
        }
        pvVar44 = (void *)((int)(((int)uVar24 >> 2) + (uVar67 - (uVar24 & 0xfffffffc))) * lVar50 +
                          (long)pvVar9);
        do {
          if (iVar32 < 1) {
            lVar27 = (ulong)((uVar19 & 1) + (uVar19 >> 2) + (uint)((uVar19 >> 1 & 1) != 0)) * lVar41
            ;
            uVar67 = 0;
            pvVar54 = pvVar44;
          }
          else {
            lVar27 = (ulong)((uVar19 >> 2) + (uVar19 & 1) + (uint)((uVar19 >> 1 & 1) != 0)) * lVar41
            ;
            auVar71 = ZEXT1664((undefined1  [16])0x0);
            lVar47 = 0;
            lVar52 = 0;
            do {
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)(local_88._0_8_ + lVar52 * 4 + lVar27);
              auVar58 = vpmovsxbw_avx(auVar3);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)((long)pvVar44 + lVar52 * 4);
              auVar57 = vpmovsxbw_avx(auVar4);
              auVar56 = vpmullw_avx(auVar57,auVar58);
              auVar58 = vpmulhw_avx(auVar58,auVar57);
              auVar58 = vpunpcklwd_avx(auVar56,auVar58);
              auVar58 = vpaddd_avx(auVar71._0_16_,auVar58);
              auVar71 = ZEXT1664(auVar58);
              lVar52 = lVar52 + 1;
              lVar47 = lVar47 + -4;
            } while (iVar32 != (int)lVar52);
            auVar58 = vphaddd_avx(auVar58,auVar58);
            auVar58 = vphaddd_avx(auVar58,auVar58);
            uVar67 = auVar58._0_4_;
            lVar27 = lVar27 - lVar47;
            pvVar54 = (void *)((long)pvVar44 - lVar47);
          }
          if (0 < iVar49) {
            auVar71 = ZEXT464(uVar67);
            uVar28 = 0;
            do {
              auVar73 = vmovdqa64_avx512f(auVar71);
              auVar71 = vpbroadcastq_avx512f();
              auVar62 = vporq_avx512f(auVar71,auVar65);
              auVar71 = vporq_avx512f(auVar71,auVar66);
              uVar68 = vpcmpuq_avx512f(auVar71,auVar63,2);
              bVar16 = (byte)uVar68;
              uVar68 = vpcmpuq_avx512f(auVar62,auVar63,2);
              bVar17 = (byte)uVar68;
              uVar55 = CONCAT11(bVar17,bVar16);
              auVar58 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(local_88._0_8_ + uVar28 + lVar27));
              auVar59[1] = ((byte)(uVar55 >> 1) & 1) * auVar58[1];
              auVar59[0] = (bVar16 & 1) * auVar58[0];
              auVar59[2] = ((byte)(uVar55 >> 2) & 1) * auVar58[2];
              auVar59[3] = ((byte)(uVar55 >> 3) & 1) * auVar58[3];
              auVar59[4] = ((byte)(uVar55 >> 4) & 1) * auVar58[4];
              auVar59[5] = ((byte)(uVar55 >> 5) & 1) * auVar58[5];
              auVar59[6] = ((byte)(uVar55 >> 6) & 1) * auVar58[6];
              auVar59[7] = ((byte)(uVar55 >> 7) & 1) * auVar58[7];
              auVar59[8] = (bVar17 & 1) * auVar58[8];
              auVar59[9] = (bVar17 >> 1 & 1) * auVar58[9];
              auVar59[10] = (bVar17 >> 2 & 1) * auVar58[10];
              auVar59[0xb] = (bVar17 >> 3 & 1) * auVar58[0xb];
              auVar59[0xc] = (bVar17 >> 4 & 1) * auVar58[0xc];
              auVar59[0xd] = (bVar17 >> 5 & 1) * auVar58[0xd];
              auVar59[0xe] = (bVar17 >> 6 & 1) * auVar58[0xe];
              auVar59[0xf] = -((char)bVar17 >> 7) * auVar58[0xf];
              auVar58 = vmovdqu8_avx512vl(*(undefined1 (*) [16])((long)pvVar54 + uVar28));
              auVar60[1] = ((byte)(uVar55 >> 1) & 1) * auVar58[1];
              auVar60[0] = (bVar16 & 1) * auVar58[0];
              auVar60[2] = ((byte)(uVar55 >> 2) & 1) * auVar58[2];
              auVar60[3] = ((byte)(uVar55 >> 3) & 1) * auVar58[3];
              auVar60[4] = ((byte)(uVar55 >> 4) & 1) * auVar58[4];
              auVar60[5] = ((byte)(uVar55 >> 5) & 1) * auVar58[5];
              auVar60[6] = ((byte)(uVar55 >> 6) & 1) * auVar58[6];
              auVar60[7] = ((byte)(uVar55 >> 7) & 1) * auVar58[7];
              auVar60[8] = (bVar17 & 1) * auVar58[8];
              auVar60[9] = (bVar17 >> 1 & 1) * auVar58[9];
              auVar60[10] = (bVar17 >> 2 & 1) * auVar58[10];
              auVar60[0xb] = (bVar17 >> 3 & 1) * auVar58[0xb];
              auVar60[0xc] = (bVar17 >> 4 & 1) * auVar58[0xc];
              auVar60[0xd] = (bVar17 >> 5 & 1) * auVar58[0xd];
              auVar60[0xe] = (bVar17 >> 6 & 1) * auVar58[0xe];
              auVar60[0xf] = -((char)bVar17 >> 7) * auVar58[0xf];
              auVar71 = vpmovsxbd_avx512f(auVar59);
              auVar62 = vpmovsxbd_avx512f(auVar60);
              auVar71 = vpmulld_avx512f(auVar62,auVar71);
              auVar71 = vpaddd_avx512f(auVar71,auVar73);
              uVar28 = uVar28 + 0x10;
            } while ((iVar49 + 0xfU & 0xfffffff0) != uVar28);
            auVar71 = vmovdqa32_avx512f(auVar71);
            auVar62._0_4_ =
                 (uint)(bVar16 & 1) * auVar71._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar73._0_4_;
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar10 * auVar71._4_4_ | (uint)!bVar10 * auVar73._4_4_;
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar10 * auVar71._8_4_ | (uint)!bVar10 * auVar73._8_4_;
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar62._12_4_ = (uint)bVar10 * auVar71._12_4_ | (uint)!bVar10 * auVar73._12_4_;
            bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
            auVar62._16_4_ = (uint)bVar10 * auVar71._16_4_ | (uint)!bVar10 * auVar73._16_4_;
            bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
            auVar62._20_4_ = (uint)bVar10 * auVar71._20_4_ | (uint)!bVar10 * auVar73._20_4_;
            bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
            auVar62._24_4_ = (uint)bVar10 * auVar71._24_4_ | (uint)!bVar10 * auVar73._24_4_;
            bVar10 = (bool)((byte)(uVar55 >> 7) & 1);
            auVar62._28_4_ = (uint)bVar10 * auVar71._28_4_ | (uint)!bVar10 * auVar73._28_4_;
            auVar62._32_4_ =
                 (uint)(bVar17 & 1) * auVar71._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar73._32_4_;
            bVar10 = (bool)(bVar17 >> 1 & 1);
            auVar62._36_4_ = (uint)bVar10 * auVar71._36_4_ | (uint)!bVar10 * auVar73._36_4_;
            bVar10 = (bool)(bVar17 >> 2 & 1);
            auVar62._40_4_ = (uint)bVar10 * auVar71._40_4_ | (uint)!bVar10 * auVar73._40_4_;
            bVar10 = (bool)(bVar17 >> 3 & 1);
            auVar62._44_4_ = (uint)bVar10 * auVar71._44_4_ | (uint)!bVar10 * auVar73._44_4_;
            bVar10 = (bool)(bVar17 >> 4 & 1);
            auVar62._48_4_ = (uint)bVar10 * auVar71._48_4_ | (uint)!bVar10 * auVar73._48_4_;
            bVar10 = (bool)(bVar17 >> 5 & 1);
            auVar62._52_4_ = (uint)bVar10 * auVar71._52_4_ | (uint)!bVar10 * auVar73._52_4_;
            bVar10 = (bool)(bVar17 >> 6 & 1);
            auVar62._56_4_ = (uint)bVar10 * auVar71._56_4_ | (uint)!bVar10 * auVar73._56_4_;
            auVar62._60_4_ =
                 (uint)(bVar17 >> 7) * auVar71._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar73._60_4_;
            auVar61 = vextracti64x4_avx512f(auVar62,1);
            auVar71 = vpaddd_avx512f(auVar62,ZEXT3264(auVar61));
            auVar58 = vpaddd_avx(auVar71._0_16_,auVar71._16_16_);
            auVar57 = vpshufd_avx(auVar58,0xee);
            auVar58 = vpaddd_avx(auVar58,auVar57);
            auVar57 = vpshufd_avx(auVar58,0x55);
            auVar58 = vpaddd_avx(auVar58,auVar57);
            uVar67 = auVar58._0_4_;
          }
          *(uint *)*pauVar40 = uVar67;
          pauVar40 = (undefined1 (*) [16])((long)*pauVar40 + 4);
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar5);
      }
      uVar31 = uVar31 + 1;
    } while ((long)uVar31 < (long)iVar6);
  }
  piVar18 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
        if ((void *)local_88._0_8_ != (void *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_88._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __SSE2__
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }
#else // __SSE2__
    tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            signed char* tmpptr = tmp.channel(i);

            int q = 0;
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }
#endif // __SSE2__

    int nn_outch = 0;
    int remain_outch_start = 0;

#if __SSE2__
    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_madd_epi16(_val23_16, _w01_16));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_madd_epi16(_val32_16, _w01_16));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val0123 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val0123 = _mm_cvtepi8_epi16(_val0123);
#else
                __m128i _extval0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val0123);
                _val0123 = _mm_unpacklo_epi8(_val0123, _extval0123);
#endif

                __m128i _val01 = _mm_shufflelo_epi16(_val0123, _MM_SHUFFLE(1, 1, 0, 0));

                _val01 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 1, 0, 0));

                __m128i _val23 = _mm_shufflelo_epi16(_val0123, _MM_SHUFFLE(3, 3, 2, 2));

                _val23 = _mm_shuffle_epi32(_val23, _MM_SHUFFLE(1, 1, 0, 0));

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum10);
                _tmp1 = _mm_unpacklo_epi32(_sum20, _sum30);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum10);
                _tmp3 = _mm_unpackhi_epi32(_sum20, _sum30);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum10 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum20 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum30 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)outptr1, _sum10);
            _mm_storeu_si128((__m128i*)outptr2, _sum20);
            _mm_storeu_si128((__m128i*)outptr3, _sum30);
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                    _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                    _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                    _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
#if __SSSE3__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                __m128i _sum00_sh = _mm_shuffle_epi32(_sum00, 216);
                __m128i _sum01_sh = _mm_shuffle_epi32(_sum01, 216);
                __m128i _sum10_sh = _mm_shuffle_epi32(_sum10, 216);
                __m128i _sum11_sh = _mm_shuffle_epi32(_sum11, 216);

                _sum00 = _mm_unpacklo_epi64(_sum00_sh, _sum01_sh);
                _sum01 = _mm_unpackhi_epi64(_sum00_sh, _sum01_sh);
                _sum10 = _mm_unpacklo_epi64(_sum10_sh, _sum11_sh);
                _sum11 = _mm_unpackhi_epi64(_sum10_sh, _sum11_sh);

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=99754
                // gcc incorrectly put 32bit to tail with _mm_loadu_si32  :(
                // 0 1 2 3 x x x x x x x x x x x x
                // x x x x x x x x x x x x 0 1 2 3
                // __m128i _w0123 = _mm_loadu_si32(kptr0);
                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __SSE2__
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum0 = 0;
            int sum1 = 0;
            int sum2 = 0;
            int sum3 = 0;

            if (nn4 > 0)
            {
                __m256i _sum0_2 = _mm256_setzero_si256();
                __m256i _sum1_3 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
                    _w = _mm_unpacklo_epi64(_w, _w);
                    __m256i _ww = _mm256_inserti128_si256(_mm256_castsi128_si256(_w), _w, 1);

                    __m256i _sl0_1 = _mm256_mullo_epi16(_val01_16, _ww);
                    __m256i _sh0_1 = _mm256_mulhi_epi16(_val01_16, _ww);

                    _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                    _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));

                    tmpptr += 16;
                    kptr0 += 4;
                }

                __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
                __m128i _sum1 = _mm256_extracti128_si256(_sum1_3, 0);
                __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
                __m128i _sum3 = _mm256_extracti128_si256(_sum1_3, 1);

                sum0 = _mm_reduce_add_epi32(_sum0);
                sum1 = _mm_reduce_add_epi32(_sum1);
                sum2 = _mm_reduce_add_epi32(_sum2);
                sum3 = _mm_reduce_add_epi32(_sum3);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val0 = tmpptr[0];
                signed char val1 = tmpptr[1];
                signed char val2 = tmpptr[2];
                signed char val3 = tmpptr[3];
                signed char w = kptr0[0];

                sum0 += val0 * w;
                sum1 += val1 * w;
                sum2 += val2 * w;
                sum3 += val3 * w;

                tmpptr += 4;
                kptr0 += 1;
            }

            outptr0[0] = sum0;
            outptr0[1] = sum1;
            outptr0[2] = sum2;
            outptr0[3] = sum3;
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum0 = 0;
            int sum1 = 0;

            if (nn4 > 0)
            {
                __m128i _sum0 = _mm_setzero_si128();
                __m128i _sum1 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                    __m128i _extval = _mm_cmpgt_epi8(_mm_setzero_si128(), _val);
                    __m128i _val01 = _mm_unpacklo_epi8(_val, _extval);

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
#else
                    __m128i _extw = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                    __m128i _w = _mm_unpacklo_epi8(_w0123, _extw);
#endif
                    _w = _mm_shuffle_epi32(_w, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _sl01 = _mm_mullo_epi16(_val01, _w);
                    __m128i _sh01 = _mm_mulhi_epi16(_val01, _w);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 8;
                    kptr0 += 4;
                }

                sum0 = _mm_reduce_add_epi32(_sum0);
                sum1 = _mm_reduce_add_epi32(_sum1);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val0 = tmpptr[0];
                signed char val1 = tmpptr[1];
                signed char w = kptr0[0];

                sum0 += val0 * w;
                sum1 += val1 * w;

                tmpptr += 2;
                kptr0 += 1;
            }

            outptr0[0] = sum0;
            outptr0[1] = sum1;
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum = 0;

            if (nn4 > 0)
            {
                __m128i _sum = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val = _mm_cvtepi8_epi16(_val0123);
#else
                    __m128i _extval = _mm_cmpgt_epi8(_mm_setzero_si128(), _val0123);
                    __m128i _val = _mm_unpacklo_epi8(_val0123, _extval);
#endif

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
#else
                    __m128i _extw = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                    __m128i _w = _mm_unpacklo_epi8(_w0123, _extw);
#endif

                    __m128i _sl = _mm_mullo_epi16(_val, _w);
                    __m128i _sh = _mm_mulhi_epi16(_val, _w);

                    _sum = _mm_add_epi32(_sum, _mm_unpacklo_epi16(_sl, _sh));

                    tmpptr += 4;
                    kptr0 += 4;
                }

                sum = _mm_reduce_add_epi32(_sum);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val = tmpptr[0];
                signed char w = kptr0[0];

                sum += val * w;

                tmpptr += 1;
                kptr0 += 1;
            }

            outptr0[0] = sum;
            outptr0 += 1;
        }
#else  // __SSE2__
        for (; i < size; i++)
        {
            const signed char* tmpptr = tmp.channel(i);
            const signed char* kptr0 = kernel.channel(p);

            int nn1 = inch * maxk;

            int sum = 0;
            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val = tmpptr[0];
                signed char w = kptr0[0];

                sum += val * w;

                tmpptr += 1;
                kptr0 += 1;
            }

            outptr0[0] = sum;
            outptr0 += 1;
        }
#endif // __SSE2__
    }
}